

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

void __thiscall
capnp::_::PipelineBuilderHook::PipelineBuilderHook(PipelineBuilderHook *this,uint firstSegmentWords)

{
  (this->super_Refcounted).refcount = 0;
  (this->super_PipelineHook)._vptr_PipelineHook = (_func_int **)&PTR_addRef_00663880;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_006638b8;
  MallocMessageBuilder::MallocMessageBuilder(&this->message,firstSegmentWords,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&this->root,&(this->message).super_MessageBuilder);
  return;
}

Assistant:

PipelineBuilderHook(uint firstSegmentWords)
      : message(firstSegmentWords),
        root(message.getRoot<AnyPointer>()) {}